

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEnginePrivate::blitImage
          (QRasterPaintEnginePrivate *this,QPointF *pt,QImage *img,QRect *clip,QRect *sr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  QRasterBuffer *pQVar7;
  qsizetype qVar8;
  QImage *in_RDX;
  QPointF *in_RSI;
  long in_RDI;
  qreal qVar9;
  int y_1;
  int len;
  uint *dst;
  uint *src;
  qsizetype dstBPL;
  int dstSize;
  int d_3;
  int d_2;
  int y;
  int cy2;
  int cy1;
  int d_1;
  int d;
  int cx2;
  int cx1;
  int x;
  int ih;
  int iw;
  int srcSize;
  uchar *srcBits;
  qsizetype srcBPL;
  QRect *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int local_90;
  uchar *local_88;
  uchar *local_80;
  int local_64;
  int local_48;
  int local_44;
  int local_40;
  uchar *local_38;
  
  bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    qVar9 = QPointF::x(in_RSI);
    iVar2 = QRect::right((QRect *)0x5635c6);
    if (qVar9 <= (double)iVar2) {
      qVar9 = QPointF::y(in_RSI);
      iVar2 = QRect::bottom((QRect *)0x5635f6);
      if (qVar9 <= (double)iVar2) {
        qVar9 = QPointF::x(in_RSI);
        iVar2 = QImage::width(in_RDX);
        iVar3 = QRect::left((QRect *)0x56364c);
        if ((double)iVar3 <= qVar9 + (double)iVar2) {
          qVar9 = QPointF::y(in_RSI);
          iVar2 = QImage::height(in_RDX);
          iVar3 = QRect::top((QRect *)0x56369d);
          if ((double)iVar3 <= qVar9 + (double)iVar2) {
            qVar6 = QImage::bytesPerLine(in_RDX);
            local_38 = QImage::bits(in_RDX);
            iVar2 = QImage::depth(in_RDX);
            local_40 = QImage::width(in_RDX);
            local_44 = QImage::height(in_RDX);
            bVar1 = QRect::isEmpty((QRect *)CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20));
            if (!bVar1) {
              local_40 = QRect::width(in_stack_ffffffffffffff18);
              local_44 = QRect::height(in_stack_ffffffffffffff18);
              iVar3 = QRect::y((QRect *)0x563761);
              iVar4 = QRect::x((QRect *)0x56377e);
              local_38 = local_38 + iVar3 * qVar6 + (long)(iVar4 * (iVar2 >> 3));
            }
            QPointF::x(in_RSI);
            local_48 = qRound(2.79164728043861e-317);
            iVar3 = QRect::x((QRect *)0x5637c9);
            iVar4 = QRect::x((QRect *)0x5637dd);
            iVar5 = QRect::width(in_stack_ffffffffffffff18);
            if (local_48 < iVar3) {
              local_38 = local_38 + (iVar2 >> 3) * (iVar3 - local_48);
              local_40 = local_40 - (iVar3 - local_48);
              local_48 = iVar3;
            }
            if (iVar4 + iVar5 < local_48 + local_40) {
              local_40 = (iVar4 + iVar5) - local_48;
            }
            if (0 < local_40) {
              iVar2 = QRect::y((QRect *)0x5638d2);
              iVar3 = QRect::y((QRect *)0x5638e6);
              iVar4 = QRect::height(in_stack_ffffffffffffff18);
              QPointF::y(in_RSI);
              local_64 = qRound(2.79182267374288e-317);
              if (local_64 < iVar2) {
                local_38 = local_38 + qVar6 * (iVar2 - local_64);
                local_44 = local_44 - (iVar2 - local_64);
                local_64 = iVar2;
              }
              if (iVar3 + iVar4 < local_64 + local_44) {
                local_44 = (iVar3 + iVar4) - local_64;
              }
              if (0 < local_44) {
                pQVar7 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::
                         operator->((QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>
                                     *)(in_RDI + 0x230));
                iVar2 = QRasterBuffer::bytesPerPixel(pQVar7);
                pQVar7 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::
                         operator->((QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>
                                     *)(in_RDI + 0x230));
                qVar8 = QRasterBuffer::bytesPerLine(pQVar7);
                local_80 = local_38;
                pQVar7 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::
                         operator->((QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>
                                     *)(in_RDI + 0x230));
                local_88 = QRasterBuffer::buffer(pQVar7);
                local_88 = local_88 + local_64 * qVar8 + (long)(local_48 * iVar2);
                pQVar7 = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::
                         operator->((QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>
                                     *)(in_RDI + 0x230));
                iVar2 = qt_depthForFormat(pQVar7->format);
                for (local_90 = 0; local_90 < local_44; local_90 = local_90 + 1) {
                  memcpy(local_88,local_80,(long)(local_40 * (iVar2 >> 3)));
                  local_88 = local_88 + qVar8;
                  local_80 = local_80 + qVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QRasterPaintEnginePrivate::blitImage(const QPointF &pt,
                                          const QImage &img,
                                          const QRect &clip,
                                          const QRect &sr)
{
    if (!clip.isValid())
        return;
    if (pt.x() > qreal(clip.right()) || pt.y() > qreal(clip.bottom()))
        return;
    if ((pt.x() + img.width()) < qreal(clip.left()) || (pt.y() + img.height()) < qreal(clip.top()))
        return;

    Q_ASSERT(img.depth() >= 8);

    qsizetype srcBPL = img.bytesPerLine();
    const uchar *srcBits = img.bits();
    int srcSize = img.depth() >> 3; // This is the part that is incompatible with lower than 8-bit..
    int iw = img.width();
    int ih = img.height();

    if (!sr.isEmpty()) {
        iw = sr.width();
        ih = sr.height();
        // Adjust the image according to the source offset...
        srcBits += ((sr.y() * srcBPL) + sr.x() * srcSize);
    }

    // adapt the x parameters
    int x = qRound(pt.x());
    int cx1 = clip.x();
    int cx2 = clip.x() + clip.width();
    if (x < cx1) {
        int d = cx1 - x;
        srcBits += srcSize * d;
        iw -= d;
        x = cx1;
    }
    if (x + iw > cx2) {
        int d = x + iw - cx2;
        iw -= d;
    }
    if (iw <= 0)
        return;

    // adapt the y parameters...
    int cy1 = clip.y();
    int cy2 = clip.y() + clip.height();
    int y = qRound(pt.y());
    if (y < cy1) {
        int d = cy1 - y;
        srcBits += srcBPL * d;
        ih -= d;
        y = cy1;
    }
    if (y + ih > cy2) {
        int d = y + ih - cy2;
        ih -= d;
    }
    if (ih <= 0)
        return;

    // blit..
    int dstSize = rasterBuffer->bytesPerPixel();
    qsizetype dstBPL = rasterBuffer->bytesPerLine();
    const uint *src = (const uint *) srcBits;
    uint *dst = reinterpret_cast<uint *>(rasterBuffer->buffer() + x * dstSize + y * dstBPL);

    const int len = iw * (qt_depthForFormat(rasterBuffer->format) >> 3);
    for (int y = 0; y < ih; ++y) {
        memcpy(dst, src, len);
        dst = (quint32 *)(((uchar *) dst) + dstBPL);
        src = (const quint32 *)(((const uchar *) src) + srcBPL);
    }
}